

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O1

Pointer<Attributes> __thiscall
anurbs::Ref<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>::attributes
          (Ref<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_> *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  Pointer<Attributes> PVar4;
  Pointer<Attributes> PVar5;
  
  peVar1 = (this->m_entry).
           super___shared_ptr<anurbs::Entry<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (peVar1->m_attributes).
                super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(in_RDI->m_tags)._M_t._M_impl = _Var3._M_pi;
  p_Var2 = (peVar1->m_attributes).super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(in_RDI->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      PVar4.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      PVar4.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (Pointer<Attributes>)
             PVar4.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    UNLOCK();
  }
  PVar5.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  PVar5.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Pointer<Attributes>)
         PVar5.super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Pointer<Attributes> attributes() const
    {
        return m_entry->attributes();
    }